

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

void __thiscall
cs::compiler_type::process_brackets
          (compiler_type *this,deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *tokens)

{
  iterator *piVar1;
  _Elt_pointer pptVar2;
  _Map_pointer ppptVar3;
  _Elt_pointer pptVar4;
  _Elt_pointer pptVar5;
  _Map_pointer ppptVar6;
  int iVar7;
  token_base *ptVar8;
  compile_error *pcVar9;
  long lVar10;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *p_Var11;
  deque<cs::token_base*,std::allocator<cs::token_base*>> *this_00;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *pdVar12;
  _Elt_pointer __args;
  _Map_pointer ppptVar13;
  _Elt_pointer pptVar14;
  _Elt_pointer pptVar15;
  byte bVar16;
  deque<int,_std::allocator<int>_> blist_stack;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  blist;
  string local_2d0;
  _Elt_pointer local_2b0;
  _Deque_base<int,_std::allocator<int>_> local_2a8;
  _Elt_pointer local_258;
  compiler_type *local_250;
  _Elt_pointer local_248;
  _Elt_pointer pptStack_240;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_238;
  _Map_pointer local_1e8;
  _func_int **local_1e0;
  _func_int **local_1d8;
  _func_int **local_1d0;
  _Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  local_1c8;
  undefined1 local_178 [32];
  _Elt_pointer local_158;
  _Map_pointer ppptStack_150;
  _Elt_pointer local_148;
  _Elt_pointer pptStack_140;
  _Elt_pointer local_138;
  _Map_pointer ppptStack_130;
  _Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  local_120;
  _Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  local_d0;
  _Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  local_80;
  
  bVar16 = 0;
  local_250 = this;
  if ((tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
      super__Deque_impl_data._M_finish._M_cur ==
      (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    pcVar9 = (compile_error *)__cxa_allocate_exception(0x28);
    local_178._0_8_ = local_178 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_178,"Received empty token buffer.","");
    compile_error::compile_error(pcVar9,(string *)local_178);
    __cxa_throw(pcVar9,&compile_error::typeinfo,compile_error::~compile_error);
  }
  process_empty_brackets(this,tokens);
  local_138 = (_Elt_pointer)0x0;
  ppptStack_130 = (_Map_pointer)0x0;
  local_148 = (_Elt_pointer)0x0;
  pptStack_140 = (_Elt_pointer)0x0;
  local_158 = (_Elt_pointer)0x0;
  ppptStack_150 = (_Map_pointer)0x0;
  local_178._16_8_ = (_Elt_pointer)0x0;
  local_178._24_8_ = (_Elt_pointer)0x0;
  local_178._0_8_ = (_Map_pointer)0x0;
  local_178._8_8_ = 0;
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::_M_initialize_map
            ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_178,0);
  local_1c8._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)
       (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_map;
  local_1c8._M_impl.super__Deque_impl_data._M_map_size =
       (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_map_size;
  local_178._16_8_ =
       (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_178._24_8_ =
       (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_158 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
              _M_impl.super__Deque_impl_data._M_start._M_last;
  ppptStack_150 =
       (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_start._M_node;
  local_148 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
  pptStack_140 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_first;
  local_138 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_last;
  ppptStack_130 =
       (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_node;
  p_Var11 = (_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_178;
  pdVar12 = tokens;
  for (lVar10 = 10; lVar10 != 0; lVar10 = lVar10 + -1) {
    (pdVar12->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
    super__Deque_impl_data._M_map = (p_Var11->_M_impl).super__Deque_impl_data._M_map;
    p_Var11 = (_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
              ((long)p_Var11 + ((ulong)bVar16 * -2 + 1) * 8);
    pdVar12 = (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
              ((long)pdVar12 + ((ulong)bVar16 * -2 + 1) * 8);
  }
  local_178._0_8_ = local_1c8._M_impl.super__Deque_impl_data._M_map;
  local_178._8_8_ = local_1c8._M_impl.super__Deque_impl_data._M_map_size;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::clear(tokens);
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1c8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::_M_initialize_map(&local_1c8,0);
  local_238._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_238._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_238._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_238._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_238._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_238._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_238._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_238._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_238._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_238._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::_M_initialize_map
            (&local_238,0);
  local_2a8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_2a8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_2a8._M_impl.super__Deque_impl_data._M_finish._M_cur = (int *)0x0;
  local_2a8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_2a8._M_impl.super__Deque_impl_data._M_start._M_last = (int *)0x0;
  local_2a8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur = (int *)0x0;
  local_2a8._M_impl.super__Deque_impl_data._M_start._M_first = (int *)0x0;
  local_2a8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_2a8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_2a8,0);
  if ((_Elt_pointer)local_178._16_8_ != local_148) {
    local_1e8 = ppptStack_150;
    local_1d0 = (_func_int **)&PTR__token_sblist_002525f0;
    local_1d8 = (_func_int **)&PTR__token_mblist_00252640;
    local_1e0 = (_func_int **)&PTR__token_lblist_00252690;
    local_258 = local_148;
    __args = (_Elt_pointer)local_178._16_8_;
    pptVar14 = local_148;
    pptVar15 = local_158;
    do {
      this_00 = (deque<cs::token_base*,std::allocator<cs::token_base*>> *)&local_238;
      iVar7 = (*(*__args)->_vptr_token_base[2])();
      if (iVar7 != 3) goto LAB_00183132;
      switch(*(int *)&(*__args)[1]._vptr_token_base) {
      case 0x1e:
        local_2d0._M_dataplus._M_p._0_4_ = 1;
        if (local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur ==
            local_2a8._M_impl.super__Deque_impl_data._M_start._M_first) {
          std::deque<int,_std::allocator<int>_>::_M_push_front_aux<int>
                    ((deque<int,_std::allocator<int>_> *)&local_2a8,(int *)&local_2d0);
        }
        else {
          local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur[-1] = 1;
LAB_00182e1d:
          local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur + -1;
        }
        goto LAB_00182e26;
      case 0x1f:
        if (local_2a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur) {
          pcVar9 = (compile_error *)__cxa_allocate_exception(0x28);
          local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2d0,"Parentheses do not match.","");
          compile_error::compile_error(pcVar9,&local_2d0);
          __cxa_throw(pcVar9,&compile_error::typeinfo,compile_error::~compile_error);
        }
        if (*local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur != 1) {
          pcVar9 = (compile_error *)__cxa_allocate_exception(0x28);
          local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2d0,
                     "The parentheses type does not match.(Request Small Bracket)","");
          compile_error::compile_error(pcVar9,&local_2d0);
          __cxa_throw(pcVar9,&compile_error::typeinfo,compile_error::~compile_error);
        }
        if (local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur ==
            local_2a8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
          operator_delete(local_2a8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
          local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_2a8._M_impl.super__Deque_impl_data._M_start._M_node[1];
          local_2a8._M_impl.super__Deque_impl_data._M_start._M_last =
               local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80;
          local_2a8._M_impl.super__Deque_impl_data._M_start._M_first =
               local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_2a8._M_impl.super__Deque_impl_data._M_start._M_node =
               local_2a8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
        }
        else {
          local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
        }
        if (local_2a8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
            local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_00183132;
        process_brackets(local_250,
                         (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)this_00);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::push_back((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                     *)&local_1c8,(value_type *)this_00);
        ptVar8 = (token_base *)token_base::operator_new((token_base *)0x60,(size_t)this_00);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 *)&local_120,
                (deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 *)&local_1c8);
        ptVar8->line_num = 1;
        ptVar8->_vptr_token_base = local_1d0;
        std::
        _Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::_Deque_base((_Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                       *)(ptVar8 + 1),&local_120);
        pptVar14 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                   _M_impl.super__Deque_impl_data._M_finish._M_cur;
        local_2d0._M_dataplus._M_p = (pointer)ptVar8;
        if (pptVar14 ==
            (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
            .super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
          _M_push_back_aux<cs::token_base*>
                    ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)tokens,
                     (token_base **)&local_2d0);
        }
        else {
          *pptVar14 = ptVar8;
          piVar1 = &(tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                    ._M_impl.super__Deque_impl_data._M_finish;
          piVar1->_M_cur = piVar1->_M_cur + 1;
        }
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                  *)&local_120);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::clear((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 *)&local_1c8);
        ppptVar3 = local_238._M_impl.super__Deque_impl_data._M_finish._M_node;
        ppptVar6 = local_238._M_impl.super__Deque_impl_data._M_start._M_node;
        local_248 = local_238._M_impl.super__Deque_impl_data._M_start._M_cur;
        pptStack_240 = local_238._M_impl.super__Deque_impl_data._M_start._M_first;
        local_2b0 = local_238._M_impl.super__Deque_impl_data._M_start._M_last;
        pptVar14 = local_258;
        for (ppptVar13 = local_238._M_impl.super__Deque_impl_data._M_start._M_node;
            local_258 = pptVar14, ppptVar13 < ppptVar3; ppptVar13 = ppptVar13 + 1) {
          operator_delete(ppptVar13[1],0x200);
          pptVar14 = local_258;
        }
        local_238._M_impl.super__Deque_impl_data._M_finish._M_node = ppptVar6;
        pptVar2 = local_248;
        pptVar4 = pptStack_240;
        pptVar5 = local_2b0;
        ppptVar6 = local_238._M_impl.super__Deque_impl_data._M_finish._M_node;
        break;
      case 0x20:
        local_2d0._M_dataplus._M_p._0_4_ = 2;
        if (local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur !=
            local_2a8._M_impl.super__Deque_impl_data._M_start._M_first) {
          local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur[-1] = 2;
          goto LAB_00182e1d;
        }
        std::deque<int,_std::allocator<int>_>::_M_push_front_aux<int>
                  ((deque<int,_std::allocator<int>_> *)&local_2a8,(int *)&local_2d0);
        goto LAB_00182e26;
      case 0x21:
        if (local_2a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur) {
          pcVar9 = (compile_error *)__cxa_allocate_exception(0x28);
          local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2d0,"Parentheses do not match.","");
          compile_error::compile_error(pcVar9,&local_2d0);
          __cxa_throw(pcVar9,&compile_error::typeinfo,compile_error::~compile_error);
        }
        if (*local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur != 2) {
          pcVar9 = (compile_error *)__cxa_allocate_exception(0x28);
          local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2d0,
                     "The parentheses type does not match.(Request Middle Bracket)","");
          compile_error::compile_error(pcVar9,&local_2d0);
          __cxa_throw(pcVar9,&compile_error::typeinfo,compile_error::~compile_error);
        }
        if (local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur ==
            local_2a8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
          operator_delete(local_2a8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
          local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_2a8._M_impl.super__Deque_impl_data._M_start._M_node[1];
          local_2a8._M_impl.super__Deque_impl_data._M_start._M_last =
               local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80;
          local_2a8._M_impl.super__Deque_impl_data._M_start._M_first =
               local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_2a8._M_impl.super__Deque_impl_data._M_start._M_node =
               local_2a8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
        }
        else {
          local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
        }
        if (local_2a8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
            local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_00183132;
        process_brackets(local_250,
                         (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)this_00);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::push_back((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                     *)&local_1c8,(value_type *)this_00);
        ptVar8 = (token_base *)token_base::operator_new((token_base *)0x60,(size_t)this_00);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 *)&local_80,
                (deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 *)&local_1c8);
        ptVar8->line_num = 1;
        ptVar8->_vptr_token_base = local_1d8;
        std::
        _Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::_Deque_base((_Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                       *)(ptVar8 + 1),&local_80);
        pptVar14 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                   _M_impl.super__Deque_impl_data._M_finish._M_cur;
        local_2d0._M_dataplus._M_p = (pointer)ptVar8;
        if (pptVar14 ==
            (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
            .super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
          _M_push_back_aux<cs::token_base*>
                    ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)tokens,
                     (token_base **)&local_2d0);
        }
        else {
          *pptVar14 = ptVar8;
          piVar1 = &(tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                    ._M_impl.super__Deque_impl_data._M_finish;
          piVar1->_M_cur = piVar1->_M_cur + 1;
        }
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                  *)&local_80);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::clear((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 *)&local_1c8);
        ppptVar3 = local_238._M_impl.super__Deque_impl_data._M_finish._M_node;
        ppptVar6 = local_238._M_impl.super__Deque_impl_data._M_start._M_node;
        local_248 = local_238._M_impl.super__Deque_impl_data._M_start._M_cur;
        pptStack_240 = local_238._M_impl.super__Deque_impl_data._M_start._M_first;
        local_2b0 = local_238._M_impl.super__Deque_impl_data._M_start._M_last;
        pptVar14 = local_258;
        for (ppptVar13 = local_238._M_impl.super__Deque_impl_data._M_start._M_node;
            local_258 = pptVar14, pptVar2 = local_248, pptVar4 = pptStack_240, pptVar5 = local_2b0,
            ppptVar13 < ppptVar3; ppptVar13 = ppptVar13 + 1) {
          operator_delete(ppptVar13[1],0x200);
          pptVar14 = local_258;
        }
        break;
      case 0x22:
        local_2d0._M_dataplus._M_p._0_4_ = 3;
        if (local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur !=
            local_2a8._M_impl.super__Deque_impl_data._M_start._M_first) {
          local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur[-1] = 3;
          goto LAB_00182e1d;
        }
        std::deque<int,_std::allocator<int>_>::_M_push_front_aux<int>
                  ((deque<int,_std::allocator<int>_> *)&local_2a8,(int *)&local_2d0);
LAB_00182e26:
        pptVar2 = local_238._M_impl.super__Deque_impl_data._M_finish._M_cur;
        pptVar4 = local_238._M_impl.super__Deque_impl_data._M_finish._M_first;
        pptVar5 = local_238._M_impl.super__Deque_impl_data._M_finish._M_last;
        ppptVar6 = local_238._M_impl.super__Deque_impl_data._M_finish._M_node;
        if (((long)local_2a8._M_impl.super__Deque_impl_data._M_start._M_last -
             (long)local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur >> 2) +
            ((long)local_2a8._M_impl.super__Deque_impl_data._M_finish._M_cur -
             (long)local_2a8._M_impl.super__Deque_impl_data._M_finish._M_first >> 2) +
            ((((ulong)((long)local_2a8._M_impl.super__Deque_impl_data._M_finish._M_node -
                      (long)local_2a8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
            (ulong)(local_2a8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)
            ) * 0x80 != 1) {
LAB_00183132:
          ppptVar6 = local_238._M_impl.super__Deque_impl_data._M_finish._M_node;
          pptVar4 = local_238._M_impl.super__Deque_impl_data._M_finish._M_first;
          pptVar5 = local_238._M_impl.super__Deque_impl_data._M_finish._M_last;
          if (local_2a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur) {
            pptVar2 = (tokens->
                      super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                      _M_impl.super__Deque_impl_data._M_finish._M_cur;
            this_00 = (deque<cs::token_base*,std::allocator<cs::token_base*>> *)tokens;
            if (pptVar2 ==
                (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                _M_impl.super__Deque_impl_data._M_finish._M_last + -1) goto LAB_00183194;
            *pptVar2 = *__args;
            piVar1 = &(tokens->
                      super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                      _M_impl.super__Deque_impl_data._M_finish;
            piVar1->_M_cur = piVar1->_M_cur + 1;
            pptVar2 = local_238._M_impl.super__Deque_impl_data._M_finish._M_cur;
          }
          else if (local_238._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                   local_238._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
LAB_00183194:
            std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
            _M_push_back_aux<cs::token_base*const&>(this_00,__args);
            pptVar2 = local_238._M_impl.super__Deque_impl_data._M_finish._M_cur;
            pptVar4 = local_238._M_impl.super__Deque_impl_data._M_finish._M_first;
            pptVar5 = local_238._M_impl.super__Deque_impl_data._M_finish._M_last;
            ppptVar6 = local_238._M_impl.super__Deque_impl_data._M_finish._M_node;
          }
          else {
            *local_238._M_impl.super__Deque_impl_data._M_finish._M_cur = *__args;
            pptVar2 = local_238._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
        }
        break;
      case 0x23:
        if (local_2a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur) {
          pcVar9 = (compile_error *)__cxa_allocate_exception(0x28);
          local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2d0,"Parentheses do not match.","");
          compile_error::compile_error(pcVar9,&local_2d0);
          __cxa_throw(pcVar9,&compile_error::typeinfo,compile_error::~compile_error);
        }
        if (*local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur != 3) {
          pcVar9 = (compile_error *)__cxa_allocate_exception(0x28);
          local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2d0,
                     "The parentheses type does not match.(Request Large Bracket)","");
          compile_error::compile_error(pcVar9,&local_2d0);
          __cxa_throw(pcVar9,&compile_error::typeinfo,compile_error::~compile_error);
        }
        if (local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur ==
            local_2a8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
          operator_delete(local_2a8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
          local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_2a8._M_impl.super__Deque_impl_data._M_start._M_node[1];
          local_2a8._M_impl.super__Deque_impl_data._M_start._M_last =
               local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80;
          local_2a8._M_impl.super__Deque_impl_data._M_start._M_first =
               local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_2a8._M_impl.super__Deque_impl_data._M_start._M_node =
               local_2a8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
        }
        else {
          local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
        }
        if (local_2a8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
            local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_00183132;
        process_brackets(local_250,
                         (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)this_00);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::push_back((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                     *)&local_1c8,(value_type *)this_00);
        ptVar8 = (token_base *)token_base::operator_new((token_base *)0x60,(size_t)this_00);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 *)&local_d0,
                (deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 *)&local_1c8);
        ptVar8->line_num = 1;
        ptVar8->_vptr_token_base = local_1e0;
        std::
        _Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::_Deque_base((_Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                       *)(ptVar8 + 1),&local_d0);
        pptVar14 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                   _M_impl.super__Deque_impl_data._M_finish._M_cur;
        local_2d0._M_dataplus._M_p = (pointer)ptVar8;
        if (pptVar14 ==
            (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
            .super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
          _M_push_back_aux<cs::token_base*>
                    ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)tokens,
                     (token_base **)&local_2d0);
        }
        else {
          *pptVar14 = ptVar8;
          piVar1 = &(tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                    ._M_impl.super__Deque_impl_data._M_finish;
          piVar1->_M_cur = piVar1->_M_cur + 1;
        }
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                  *)&local_d0);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::clear((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 *)&local_1c8);
        ppptVar3 = local_238._M_impl.super__Deque_impl_data._M_finish._M_node;
        ppptVar6 = local_238._M_impl.super__Deque_impl_data._M_start._M_node;
        local_248 = local_238._M_impl.super__Deque_impl_data._M_start._M_cur;
        pptStack_240 = local_238._M_impl.super__Deque_impl_data._M_start._M_first;
        local_2b0 = local_238._M_impl.super__Deque_impl_data._M_start._M_last;
        pptVar14 = local_258;
        for (ppptVar13 = local_238._M_impl.super__Deque_impl_data._M_start._M_node;
            local_258 = pptVar14, pptVar2 = local_248, pptVar4 = pptStack_240, pptVar5 = local_2b0,
            ppptVar13 < ppptVar3; ppptVar13 = ppptVar13 + 1) {
          operator_delete(ppptVar13[1],0x200);
          pptVar14 = local_258;
        }
        break;
      default:
        if ((*(int *)&(*__args)[1]._vptr_token_base != 0xd) ||
           (((long)local_2a8._M_impl.super__Deque_impl_data._M_start._M_last -
             (long)local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur >> 2) +
            ((long)local_2a8._M_impl.super__Deque_impl_data._M_finish._M_cur -
             (long)local_2a8._M_impl.super__Deque_impl_data._M_finish._M_first >> 2) +
            ((((ulong)((long)local_2a8._M_impl.super__Deque_impl_data._M_finish._M_node -
                      (long)local_2a8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
            (ulong)(local_2a8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)
            ) * 0x80 != 1)) goto LAB_00183132;
        process_brackets(local_250,
                         (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)this_00);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::push_back((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                     *)&local_1c8,(value_type *)this_00);
        ppptVar3 = local_238._M_impl.super__Deque_impl_data._M_finish._M_node;
        ppptVar6 = local_238._M_impl.super__Deque_impl_data._M_start._M_node;
        local_248 = local_238._M_impl.super__Deque_impl_data._M_start._M_cur;
        pptStack_240 = local_238._M_impl.super__Deque_impl_data._M_start._M_first;
        local_2b0 = local_238._M_impl.super__Deque_impl_data._M_start._M_last;
        pptVar14 = local_258;
        for (ppptVar13 = local_238._M_impl.super__Deque_impl_data._M_start._M_node;
            local_258 = pptVar14, pptVar2 = local_248, pptVar4 = pptStack_240, pptVar5 = local_2b0,
            ppptVar13 < ppptVar3; ppptVar13 = ppptVar13 + 1) {
          operator_delete(ppptVar13[1],0x200);
          pptVar14 = local_258;
        }
      }
      local_238._M_impl.super__Deque_impl_data._M_finish._M_node = ppptVar6;
      local_238._M_impl.super__Deque_impl_data._M_finish._M_last = pptVar5;
      local_238._M_impl.super__Deque_impl_data._M_finish._M_first = pptVar4;
      local_238._M_impl.super__Deque_impl_data._M_finish._M_cur = pptVar2;
      __args = __args + 1;
      if (__args == pptVar15) {
        __args = local_1e8[1];
        local_1e8 = local_1e8 + 1;
        pptVar15 = __args + 0x40;
      }
    } while (__args != pptVar14);
  }
  if (local_2a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_2a8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_2a8);
    std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_238);
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              *)&local_1c8);
    std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
              ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)local_178);
    return;
  }
  pcVar9 = (compile_error *)__cxa_allocate_exception(0x28);
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2d0,"Parentheses do not match.","");
  compile_error::compile_error(pcVar9,&local_2d0);
  __cxa_throw(pcVar9,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

void compiler_type::process_brackets(std::deque<token_base *> &tokens)
	{
		if (tokens.empty())
			throw compile_error("Received empty token buffer.");
		process_empty_brackets(tokens);
		std::deque<token_base *> oldt;
		std::swap(tokens, oldt);
		tokens.clear();
		std::deque<std::deque<token_base *>> blist;
		std::deque<token_base *> btokens;
		std::deque<int> blist_stack;
		for (auto &ptr: oldt) {
			if (ptr->get_type() == token_types::signal) {
				switch (static_cast<token_signal *>(ptr)->get_signal()) {
				default:
					break;
				case signal_types::slb_:
					blist_stack.push_front(1);
					if (blist_stack.size() == 1)
						continue;
					break;
				case signal_types::mlb_:
					blist_stack.push_front(2);
					if (blist_stack.size() == 1)
						continue;
					break;
				case signal_types::llb_:
					blist_stack.push_front(3);
					if (blist_stack.size() == 1)
						continue;
					break;
				case signal_types::srb_:
					if (blist_stack.empty())
						throw compile_error("Parentheses do not match.");
					if (blist_stack.front() != 1)
						throw compile_error("The parentheses type does not match.(Request Small Bracket)");
					blist_stack.pop_front();
					if (blist_stack.empty()) {
						process_brackets(btokens);
						blist.push_back(btokens);
						tokens.push_back(new token_sblist(blist));
						blist.clear();
						btokens.clear();
						continue;
					}
					break;
				case signal_types::mrb_:
					if (blist_stack.empty())
						throw compile_error("Parentheses do not match.");
					if (blist_stack.front() != 2)
						throw compile_error("The parentheses type does not match.(Request Middle Bracket)");
					blist_stack.pop_front();
					if (blist_stack.empty()) {
						process_brackets(btokens);
						blist.push_back(btokens);
						tokens.push_back(new token_mblist(blist));
						blist.clear();
						btokens.clear();
						continue;
					}
					break;
				case signal_types::lrb_:
					if (blist_stack.empty())
						throw compile_error("Parentheses do not match.");
					if (blist_stack.front() != 3)
						throw compile_error("The parentheses type does not match.(Request Large Bracket)");
					blist_stack.pop_front();
					if (blist_stack.empty()) {
						process_brackets(btokens);
						blist.push_back(btokens);
						tokens.push_back(new token_lblist(blist));
						blist.clear();
						btokens.clear();
						continue;
					}
					break;
				case signal_types::com_:
					if (blist_stack.size() == 1) {
						process_brackets(btokens);
						blist.push_back(btokens);
						btokens.clear();
						continue;
					}
					break;
				}
			}
			if (blist_stack.empty())
				tokens.push_back(ptr);
			else
				btokens.push_back(ptr);
		}
		if (!blist_stack.empty())
			throw compile_error("Parentheses do not match.");
	}